

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QPersistentModelIndex>::reallocate
          (QMovableArrayOps<QPersistentModelIndex> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QPersistentModelIndex>_*,_QPersistentModelIndex_*> pVar1;
  
  pVar1 = QTypedArrayData<QPersistentModelIndex>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QPersistentModelIndex>).
                     super_QArrayDataPointer<QPersistentModelIndex>.d,
                     (this->super_QGenericArrayOps<QPersistentModelIndex>).
                     super_QArrayDataPointer<QPersistentModelIndex>.ptr,alloc,option);
  (this->super_QGenericArrayOps<QPersistentModelIndex>).
  super_QArrayDataPointer<QPersistentModelIndex>.d = pVar1.first;
  (this->super_QGenericArrayOps<QPersistentModelIndex>).
  super_QArrayDataPointer<QPersistentModelIndex>.ptr = pVar1.second;
  return;
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }